

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

JavascriptString *
Js::LiteralStringWithPropertyStringPtr::NewFromWideString
          (char16 *wideString,CharCount charCount,JavascriptLibrary *library)

{
  code *pcVar1;
  ScriptContext *this;
  bool bVar2;
  undefined4 *puVar3;
  CharStringCache *this_00;
  Recycler *pRVar4;
  LiteralStringWithPropertyStringPtr *this_01;
  TrackAllocData local_a8;
  code *local_80;
  undefined8 local_78;
  TrackAllocData local_70;
  char16_t *local_48;
  char16 *destString;
  ScriptContext *scriptContext;
  Recycler *recycler;
  JavascriptString *emptyString;
  JavascriptLibrary *library_local;
  char16 *pcStack_18;
  CharCount charCount_local;
  char16 *wideString_local;
  
  emptyString = (JavascriptString *)library;
  library_local._4_4_ = charCount;
  pcStack_18 = wideString;
  if ((library == (JavascriptLibrary *)0x0) || (wideString == (char16 *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x20,"(library != nullptr && wideString != nullptr)",
                                "library != nullptr && wideString != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (library_local._4_4_ == 0) {
    recycler = (Recycler *)JavascriptLibrary::GetEmptyString((JavascriptLibrary *)emptyString);
    bVar2 = VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::HasVirtualTable(recycler);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                  ,0x28,
                                  "(VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::HasVirtualTable(emptyString))"
                                  ,
                                  "Library::GetEmptyString is no longer LiteralStringWithPropertyStringPtr ?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    wideString_local = (char16 *)recycler;
  }
  else if (library_local._4_4_ == 1) {
    this_00 = JavascriptLibrary::GetCharStringCache((JavascriptLibrary *)emptyString);
    wideString_local = (char16 *)CharStringCache::GetStringForChar(this_00,*pcStack_18);
  }
  else {
    scriptContext =
         (ScriptContext *)JavascriptLibrary::GetRecycler((JavascriptLibrary *)emptyString);
    destString = (char16 *)JavascriptLibrary::GetScriptContext((JavascriptLibrary *)emptyString);
    this = scriptContext;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_70,(type_info *)&char16_t::typeinfo,0,(ulong)(library_local._4_4_ + 1),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
               ,0x35);
    pRVar4 = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_70);
    local_80 = Memory::Recycler::AllocLeaf;
    local_78 = 0;
    local_48 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,
                          (ulong)(library_local._4_4_ + 1));
    if (local_48 == (char16_t *)0x0) {
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)destString);
    }
    js_wmemcpy_s(local_48,(ulong)library_local._4_4_,pcStack_18,(ulong)library_local._4_4_);
    local_48[library_local._4_4_] = L'\0';
    pRVar4 = JavascriptLibrary::GetRecycler((JavascriptLibrary *)emptyString);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a8,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
               ,0x3f);
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_a8);
    this_01 = (LiteralStringWithPropertyStringPtr *)new<Memory::Recycler>(0x30,pRVar4,0x43c4b0);
    LiteralStringWithPropertyStringPtr
              (this_01,local_48,library_local._4_4_,(JavascriptLibrary *)emptyString);
    wideString_local = (char16 *)this_01;
  }
  return (JavascriptString *)wideString_local;
}

Assistant:

JavascriptString * LiteralStringWithPropertyStringPtr::
    NewFromWideString(const char16 * wideString, const CharCount charCount, JavascriptLibrary *const library)
    {
        Assert(library != nullptr && wideString != nullptr);

        switch (charCount)
        {
            case 0:
            {
                JavascriptString * emptyString = library->GetEmptyString();
                AssertMsg(VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::HasVirtualTable(emptyString),
                    "Library::GetEmptyString is no longer LiteralStringWithPropertyStringPtr ?");
                return emptyString;
            }
            case 1:
            {
                return library->GetCharStringCache().GetStringForChar((char16(*wideString)));
            }
            default:
                break;
        }

        Recycler * recycler = library->GetRecycler();
        ScriptContext * scriptContext = library->GetScriptContext();
        char16* destString = RecyclerNewArrayLeaf(recycler, WCHAR, charCount + 1);

        if (destString == nullptr)
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        js_wmemcpy_s(destString, charCount, wideString, charCount);
        destString[charCount] = char16(0);

        return (JavascriptString*) RecyclerNew(library->GetRecycler(), LiteralStringWithPropertyStringPtr, destString, charCount, library);
    }